

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O2

Point2f __thiscall pbrt::HaltonPixelIndexer::SampleFirst2D(HaltonPixelIndexer *this)

{
  undefined1 auVar1 [16];
  Float FVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar3 [64];
  undefined1 extraout_var [60];
  
  FVar2 = RadicalInverse(0,this->sampleIndex >>
                           ((ulong)(byte)(this->baseExponents).super_Tuple2<pbrt::Point2,_int>.x &
                           0x3f));
  auVar3._0_4_ = RadicalInverse(1,this->sampleIndex /
                                  (long)(this->baseScales).super_Tuple2<pbrt::Point2,_int>.y);
  auVar3._4_60_ = extraout_var;
  auVar1._4_4_ = extraout_XMM0_Db;
  auVar1._0_4_ = FVar2;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._12_4_ = extraout_XMM0_Dd;
  auVar1 = vinsertps_avx(auVar1,auVar3._0_16_,0x10);
  return (Point2f)auVar1._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f SampleFirst2D() const {
        return {RadicalInverse(0, sampleIndex >> baseExponents[0]),
                RadicalInverse(1, sampleIndex / baseScales[1])};
    }